

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::init
          (LayoutBindingNegativeCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  deUint32 dVar2;
  int y;
  int iVar3;
  int extraout_EAX;
  RenderContext *pRVar4;
  deUint32 extraout_var;
  char *str;
  ContextInfo *this_00;
  NotSupportedError *pNVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined4 extraout_var_00;
  bool local_afa;
  MessageBuilder local_ae8;
  int local_964;
  MessageBuilder local_960;
  MessageBuilder local_7e0;
  MessageBuilder local_660;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  MessageBuilder local_1e0;
  int local_60;
  deUint32 local_5c;
  int numShaderStages;
  int local_44;
  int local_40;
  GLint maxUnits;
  GLint maxTessEvalUnits;
  GLint maxTessCtrlUnits;
  GLint maxCombinedUnits;
  GLint maxFragmentUnits;
  GLint maxVertexUnits;
  GLint numBindingPoints;
  Random rnd;
  Functions *gl;
  LayoutBindingNegativeCase *this_local;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar4->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&maxVertexUnits,dVar2 ^ 0xff23a4);
  maxFragmentUnits = 0;
  maxCombinedUnits = 0;
  maxTessCtrlUnits = 0;
  maxTessEvalUnits = 0;
  maxUnits = 0;
  local_40 = 0;
  local_44 = 0;
  this_00 = Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_tessellation_shader");
  local_afa = true;
  if (!bVar1) {
    pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
    numShaderStages = (*pRVar4->_vptr_RenderContext[2])();
    local_5c = (deUint32)glu::ApiType::es(3,2);
    local_afa = glu::contextSupports((ContextType)numShaderStages,(ApiType)local_5c);
  }
  this->m_tessSupport = local_afa;
  if (((this->m_tessSupport & 1U) == 0) &&
     ((this->m_shaderType == SHADERTYPE_TESS_EVALUATION ||
      (this->m_shaderType == SHADERTYPE_TESS_CONTROL)))) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Tesselation shaders not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x309);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  local_60 = (this->m_tessSupport & 1) * 2 + 2;
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxVertexUnitsEnum,&maxCombinedUnits);
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxFragmentUnitsEnum,&maxTessCtrlUnits);
  if ((this->m_tessSupport & 1U) != 0) {
    (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxTessCtrlUnitsEnum,&maxUnits);
    (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxTessEvalUnitsEnum,&local_40);
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxCombinedUnitsEnum,&maxTessEvalUnits);
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxBindingPointEnum,&maxFragmentUnits);
  dVar2 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar2,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x318);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1e0,
                      (char (*) [54])"Maximum units for uniform type in the vertex shader: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&maxCombinedUnits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_360,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_360,
                      (char (*) [56])"Maximum units for uniform type in the fragment shader: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&maxTessCtrlUnits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  if ((this->m_tessSupport & 1U) != 0) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_4e0,
                        (char (*) [68])
                        "Maximum units for uniform type in the tessellation control shader: ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&maxUnits);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_660,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_660,
                        (char (*) [71])
                        "Maximum units for uniform type in the tessellation evaluation shader: ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&maxUnits);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_660);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_7e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_7e0,(char (*) [42])"Maximum combined units for uniform type: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&maxTessEvalUnits);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_7e0);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_960,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_960,(char (*) [41])"Maximum binding point for uniform type: ");
  local_964 = maxFragmentUnits + -1;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_964);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_960);
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    local_44 = maxCombinedUnits;
    break;
  case SHADERTYPE_FRAGMENT:
    local_44 = maxTessCtrlUnits;
    break;
  case SHADERTYPE_TESS_CONTROL:
    local_44 = maxUnits;
    break;
  case SHADERTYPE_TESS_EVALUATION:
    local_44 = local_40;
    break;
  case SHADERTYPE_ALL:
    iVar3 = de::min<int>(maxCombinedUnits,maxTessCtrlUnits);
    y = de::min<int>(maxUnits,local_40);
    iVar3 = de::min<int>(iVar3,y);
    local_44 = de::min<int>(iVar3,maxTessEvalUnits / local_60);
  }
  if (this->m_testType < TESTTYPE_BINDING_MULTIPLE) {
    this->m_numBindings = 1;
  }
  else if (this->m_testType - TESTTYPE_BINDING_MULTIPLE < 3) {
    if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
      if (local_44 < 3) {
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar5,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x350);
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      iVar3 = deMin32(7,local_44 + -1);
      iVar3 = de::Random::getInt((Random *)&maxVertexUnits,2,iVar3);
      this->m_numBindings = iVar3;
    }
    else {
      if (local_44 < 2) {
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar5,"Not enough uniforms available for test",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                   ,0x356);
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      iVar3 = deMin32(7,local_44);
      iVar3 = de::Random::getInt((Random *)&maxVertexUnits,2,iVar3);
      this->m_numBindings = iVar3;
    }
  }
  if (((this->m_shaderType == SHADERTYPE_VERTEX) || (this->m_shaderType == SHADERTYPE_ALL)) &&
     (maxCombinedUnits < this->m_numBindings)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Vertex shader: not enough uniforms available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x361);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->m_shaderType == SHADERTYPE_FRAGMENT) || (this->m_shaderType == SHADERTYPE_ALL)) &&
     (maxTessCtrlUnits < this->m_numBindings)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Fragment shader: not enough uniforms available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x364);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->m_tessSupport & 1U) != 0) &&
      ((this->m_shaderType == SHADERTYPE_TESS_CONTROL || (this->m_shaderType == SHADERTYPE_ALL))))
     && (maxUnits < this->m_numBindings)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Tessellation control shader: not enough uniforms available for test",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x367);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->m_tessSupport & 1U) != 0) &&
     (((this->m_shaderType == SHADERTYPE_TESS_EVALUATION || (this->m_shaderType == SHADERTYPE_ALL))
      && (local_40 < this->m_numBindings)))) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Tessellation evaluation shader: not enough uniforms available for test",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x36a);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((this->m_shaderType == SHADERTYPE_ALL) && (maxTessEvalUnits < this->m_numBindings * local_60))
  {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Not enough uniforms available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x36d);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (maxFragmentUnits < this->m_numBindings) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x371);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((this->m_errorType == ERRORTYPE_CONTRADICTORY) && (maxFragmentUnits == this->m_numBindings)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Not enough binding points available for test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x374);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  initBindingPoints(this,0,maxFragmentUnits);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_ae8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_ae8,(char (*) [22])"Creating test shaders");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ae8);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar3);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar6,this->m_program);
  de::Random::~Random((Random *)&maxVertexUnits);
  return extraout_EAX;
}

Assistant:

void LayoutBindingNegativeCase::init (void)
{
	// Decide appropriate binding points for the vertex and fragment shaders
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
	glw::GLint				numBindingPoints	= 0;	// Number of binding points
	glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
	glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
	glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
	glw::GLint				maxTessCtrlUnits	= 0;	// Available uniforms in tessellation control shader
	glw::GLint				maxTessEvalUnits	= 0;	// Available uniforms in tessellation evaluation shader
	glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

	m_tessSupport = m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader")
					|| contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!m_tessSupport && (m_shaderType == SHADERTYPE_TESS_EVALUATION || m_shaderType == SHADERTYPE_TESS_CONTROL))
		TCU_THROW(NotSupportedError, "Tesselation shaders not supported");

	int numShaderStages = m_tessSupport ? 4 : 2;

	gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
	gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);

	if (m_tessSupport)
	{
		gl.getIntegerv(m_maxTessCtrlUnitsEnum, &maxTessCtrlUnits);
		gl.getIntegerv(m_maxTessEvalUnitsEnum, &maxTessEvalUnits);
	}

	gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
	gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;

	if (m_tessSupport)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation control shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the tessellation evaluation shader: " << maxTessCtrlUnits << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

	// Select maximum number of uniforms used for the test
	switch (m_shaderType)
	{
		case SHADERTYPE_VERTEX:
			maxUnits = maxVertexUnits;
			break;

		case SHADERTYPE_FRAGMENT:
			maxUnits = maxFragmentUnits;
			break;

		case SHADERTYPE_ALL:
			maxUnits = de::min(de::min(de::min(maxVertexUnits, maxFragmentUnits), de::min(maxTessCtrlUnits, maxTessEvalUnits)), maxCombinedUnits/numShaderStages);
			break;

		case SHADERTYPE_TESS_CONTROL:
			maxUnits = maxTessCtrlUnits;
			break;

		case SHADERTYPE_TESS_EVALUATION:
			maxUnits = maxTessEvalUnits;
			break;

		default:
			DE_ASSERT(false);
	}

	// Select the number of uniforms (= bindings) used for this test
	switch (m_testType)
	{
		case TESTTYPE_BINDING_SINGLE:
		case TESTTYPE_BINDING_MAX:
			m_numBindings = 1;
			break;

		case TESTTYPE_BINDING_MULTIPLE:
		case TESTTYPE_BINDING_ARRAY:
		case TESTTYPE_BINDING_MAX_ARRAY:
			if (m_errorType == ERRORTYPE_CONTRADICTORY)
			{
				// leave room for contradictory case
				if (maxUnits < 3)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits-1));
			}
			else
			{
				if (maxUnits < 2)
					TCU_THROW(NotSupportedError, "Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
			}
			break;

		default:
			DE_ASSERT(false);
	}

	// Check that we have enough uniforms in different shaders to perform the tests
	if (((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Vertex shader: not enough uniforms available for test");

	if (((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Fragment shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_CONTROL) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessCtrlUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation control shader: not enough uniforms available for test");

	if (m_tessSupport && ((m_shaderType == SHADERTYPE_TESS_EVALUATION) || (m_shaderType == SHADERTYPE_ALL)) && (maxTessEvalUnits < m_numBindings) )
		TCU_THROW(NotSupportedError, "Tessellation evaluation shader: not enough uniforms available for test");

	if ((m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*numShaderStages) )
		TCU_THROW(NotSupportedError, "Not enough uniforms available for test");

	// Check that we have enough binding points to perform the tests
	if (numBindingPoints < m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	if (m_errorType == ERRORTYPE_CONTRADICTORY && numBindingPoints == m_numBindings)
		TCU_THROW(NotSupportedError, "Not enough binding points available for test");

	// Initialize the binding points i.e. populate the two binding point vectors
	initBindingPoints(0, numBindingPoints);

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;
}